

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCGeometryCollider.cpp
# Opt level: O2

int chrono::collision::ChGeometryCollider::ComputeSphereSphereCollisions
              (ChSphere *mgeo1,Vector *c1,ChSphere *mgeo2,Vector *c2,
              ChNarrowPhaseCollider *mcollider,bool just_intersection)

{
  double dVar1;
  double dVar2;
  undefined7 in_register_00000089;
  double dVar3;
  undefined1 auVar4 [16];
  Vector dir;
  ChVector<float> local_108;
  undefined1 local_f8 [16];
  double local_e8;
  ChVector<double> result;
  undefined1 local_b8 [16];
  double local_a8;
  ChCollisionPair temp;
  
  local_b8 = vsubpd_avx(*(undefined1 (*) [16])c2->m_data,*(undefined1 (*) [16])c1->m_data);
  local_a8 = c2->m_data[2] - c1->m_data[2];
  Vnorm<double>(&dir,(ChVector<double> *)local_b8);
  dVar3 = ChVector<double>::Length((ChVector<double> *)local_b8);
  dVar1 = mgeo1->rad;
  dVar2 = mgeo2->rad;
  if ((int)CONCAT71(in_register_00000089,just_intersection) == 0) {
    if (dVar1 + dVar2 + 0.0022 <= dVar3) {
      return 0;
    }
    result.m_data[0] = dVar1 * dir.m_data[0] + c1->m_data[0];
    result.m_data[1] = dVar1 * dir.m_data[1] + c1->m_data[1];
    result.m_data[2] = dVar1 * dir.m_data[2] + c1->m_data[2];
    local_108.m_data[2] = (float)dir.m_data[2];
    auVar4._0_8_ = dVar2 * dir.m_data[0];
    auVar4._8_8_ = dVar2 * dir.m_data[1];
    local_f8 = vsubpd_avx(*(undefined1 (*) [16])c2->m_data,auVar4);
    local_e8 = c2->m_data[2] - dVar2 * dir.m_data[2];
    auVar4 = vcvtpd2ps_avx((undefined1  [16])dir.m_data._0_16_);
    local_108.m_data._0_8_ = vmovlpd_avx(auVar4);
    ChCollisionPair::ChCollisionPair
              (&temp,&mgeo1->super_ChGeometry,&mgeo2->super_ChGeometry,&result,
               (ChVector<double> *)local_f8,&local_108,(float *)0x0);
  }
  else {
    if (dVar1 + dVar2 <= dVar3) {
      return 0;
    }
    ChCollisionPair::ChCollisionPair(&temp,&mgeo1->super_ChGeometry,&mgeo2->super_ChGeometry);
  }
  ChNarrowPhaseCollider::AddCollisionPair(mcollider,&temp);
  return 1;
}

Assistant:

int ChGeometryCollider::ComputeSphereSphereCollisions(
    geometry::ChSphere& mgeo1,         ///< first sphere
    Vector* c1,                        ///< absolute position of 1st
    geometry::ChSphere& mgeo2,         ///< second sphere
    Vector* c2,                        ///< absolute position of 2nd
    ChNarrowPhaseCollider& mcollider,  ///< reference to a collider to store contacts into
    bool just_intersection) {
    Vector relPos = Vsub(*c2, *c1);
    Vector dir = Vnorm(relPos);
    double dist = Vlength(relPos);
    if (just_intersection) {
        if (dist < (mgeo1.rad + mgeo2.rad)) {
            ChCollisionPair temp = ChCollisionPair(&mgeo1, &mgeo2);
            mcollider.AddCollisionPair(&temp);
            return 1;
        }
    } else {
        if (dist < CH_COLL_ENVELOPE + (mgeo1.rad + mgeo2.rad)) {
            ChCollisionPair temp = ChCollisionPair(&mgeo1, &mgeo2,                    // geometries
                                                   Vadd(*c1, Vmul(dir, mgeo1.rad)),   // p1
                                                   Vadd(*c2, Vmul(dir, -mgeo2.rad)),  // p2
                                                   dir);                              // normal
            mcollider.AddCollisionPair(&temp);
            return 1;
        }
    }

    return 0;
}